

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O3

bool __thiscall glslang::TIntermTyped::isIntegerDomain(TIntermTyped *this)

{
  byte bVar1;
  
  bVar1 = (this->type).field_0x8;
  return (bool)((byte)(0x2ff0 >> (bVar1 & 0x1f)) & bVar1 < 0xe);
}

Assistant:

virtual bool isIntegerDomain() const
    {
        switch (basicType) {
        case EbtInt8:
        case EbtUint8:
        case EbtInt16:
        case EbtUint16:
        case EbtInt:
        case EbtUint:
        case EbtInt64:
        case EbtUint64:
        case EbtAtomicUint:
            return true;
        default:
            break;
        }
        return false;
    }